

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O1

void __thiscall Fl_Type::write_comment_h(Fl_Type *this,char *pre)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  if ((this->comment_ != (char *)0x0) && (*this->comment_ != '\0')) {
    write_h("%s/**\n");
    pcVar2 = this->comment_;
    write_h("%s ",pre);
    while( true ) {
      while( true ) {
        pcVar3 = pcVar2 + 1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar3;
        if (cVar1 != '\n') break;
        if (*pcVar3 != '\0') {
          write_h("\n%s ",pre);
        }
      }
      if (cVar1 == '\0') break;
      write_h("%c",(ulong)(uint)(int)cVar1);
    }
    write_h("\n%s*/\n",pre);
    return;
  }
  return;
}

Assistant:

const char *comment() { return comment_; }